

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_MinipointCounterTest_RoundWindPair_Test::~TEST_MinipointCounterTest_RoundWindPair_Test
          (TEST_MinipointCounterTest_RoundWindPair_Test *this)

{
  TEST_GROUP_CppUTestGroupMinipointCounterTest::~TEST_GROUP_CppUTestGroupMinipointCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(MinipointCounterTest, RoundWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::EastWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}